

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O1

void decorated_win_size(Fl_Window *win,int *w,int *h)

{
  int iVar1;
  uint n;
  Window *children;
  Window parent;
  Window root;
  XWindowAttributes attributes;
  undefined1 local_c0 [8];
  long local_b8;
  long local_b0;
  undefined1 local_a8 [8];
  int local_a0;
  int local_9c;
  
  *w = (win->super_Fl_Group).super_Fl_Widget.w_;
  *h = (win->super_Fl_Group).super_Fl_Widget.h_;
  if (((win->i != (Fl_X *)0x0) && ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0)
      ) && (((win->super_Fl_Group).super_Fl_Widget.flags_ & 10) == 0)) {
    iVar1 = XQueryTree(fl_display,win->i->xid,&local_b0,&local_b8,local_c0);
    if ((iVar1 != 0) && (local_b0 != local_b8)) {
      XGetWindowAttributes(fl_display,local_b8,local_a8);
      *w = local_a0;
      *h = local_9c;
    }
    return;
  }
  return;
}

Assistant:

int w() const {return w_;}